

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall nite::Batch::flush(Batch *this)

{
  RenderFunction p_Var1;
  PFNGLBINDFRAMEBUFFERPROC p_Var2;
  reference pvVar3;
  size_type sVar4;
  reference ppRVar5;
  int local_14;
  int i;
  Batch *this_local;
  
  if ((uint)this->objectId < 0x80000000) {
    if (currentBatch != (Batch *)0x0) {
      print("bad Batch::flush(): check your code, a batch is not closing properly");
    }
    p_Var2 = __glewBindFramebuffer;
    pvVar3 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId)
    ;
    (*p_Var2)(0x8ca9,pvVar3->framebufferId);
    setupTarget((this->size).x,(this->size).y);
    for (local_14 = 0;
        sVar4 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                          (&this->objects), (ulong)(long)local_14 < sVar4; local_14 = local_14 + 1)
    {
      ppRVar5 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::operator[]
                          (&this->objects,(long)local_14);
      p_Var1 = (*ppRVar5)->function;
      ppRVar5 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::operator[]
                          (&this->objects,(long)local_14);
      (*p_Var1)(*ppRVar5);
    }
    (*__glewBindFramebuffer)(0x8ca9,0);
    clearBuffer(this);
  }
  return;
}

Assistant:

void nite::Batch::flush(){
	if(objectId <= -1) return;
	if(currentBatch != NULL){
		nite::print("bad Batch::flush(): check your code, a batch is not closing properly");
	}	
	glBindFramebuffer(GL_DRAW_FRAMEBUFFER, batches[objectId].framebufferId);
	setupTarget(size.x, size.y);
	for(int i = 0; i < objects.size(); ++i){
		objects[i]->function(objects[i]);
	}
	glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	clearBuffer();
}